

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O0

void do_x25519(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  uint8_t *in_RDX;
  uint8_t s [32];
  mg P;
  mg res;
  limb_t *in_stack_00000108;
  limb_t *in_stack_00000110;
  limb_t local_b8 [4];
  limb_t *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  uint8_t *in_stack_ffffffffffffff80;
  mg *in_stack_ffffffffffffff88;
  mg *in_stack_ffffffffffffff90;
  
  fld_import(local_b8,in_RDX);
  fld_set0((limb_t *)&stack0xffffffffffffff70,1);
  mg_scale(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  fld_inv(in_stack_00000110,in_stack_00000108);
  fld_mul((limb_t *)P.x[2],(limb_t *)P.x[1],(limb_t *)P.x[0]);
  fld_export(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

static void
do_x25519(uint8_t out[X25519_KEY_LEN],
	     const uint8_t scalar[X25519_KEY_LEN],
	     const uint8_t point[X25519_KEY_LEN])
{
	struct mg res, P;
	uint8_t s[X25519_KEY_LEN];

	memcpy(s, scalar, X25519_KEY_LEN);
	s[0] &= 0xf8;
	s[31] &= 0x7f;
	s[31] |= 0x40;
 	
	fld_import(P.x, point);
	fld_set0(P.z, 1);
	
	mg_scale(&res, &P, s);

	fld_inv(res.z, res.z);
	fld_mul(res.x, res.x, res.z);
	fld_export(out, res.x);
}